

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void tcg_op_remove_ppc64(TCGContext_conflict10 *s,TCGOp *op)

{
  byte bVar1;
  QTailQLink *pQVar2;
  anon_union_16_2_aaf24f3d_for_link *paVar3;
  long lVar4;
  
  bVar1 = *(byte *)op;
  if (bVar1 < 0x2d) {
    if (bVar1 == 3) {
      lVar4 = 0x18;
    }
    else {
      if (bVar1 != 0x26) goto LAB_00b37f99;
LAB_00b37f6e:
      lVar4 = 0x30;
    }
  }
  else {
    if (bVar1 != 0x2d) {
      if (bVar1 != 0x67) goto LAB_00b37f99;
      goto LAB_00b37f6e;
    }
    lVar4 = 0x40;
  }
  lVar4 = *(long *)((long)op->args + lVar4 + -0x18);
  *(short *)(lVar4 + 2) = (short)((uint)*(ushort *)(lVar4 + 2) * 0x10000 + -0x10000 >> 0x10);
LAB_00b37f99:
  pQVar2 = (op->link).tqe_circ.tql_prev;
  paVar3 = &((op->link).tqe_next)->link;
  if ((op->link).tqe_next == (TCGOp *)0x0) {
    paVar3 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
  }
  (paVar3->tqe_circ).tql_prev = pQVar2;
  pQVar2->tql_next = (op->link).tqe_next;
  (op->link).tqe_next = (TCGOp *)0x0;
  (op->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  pQVar2 = (s->free_ops).tqh_circ.tql_prev;
  (op->link).tqe_circ.tql_prev = pQVar2;
  pQVar2->tql_next = op;
  (s->free_ops).tqh_circ.tql_prev = (QTailQLink *)&op->link;
  s->nb_ops = s->nb_ops + -1;
  return;
}

Assistant:

void tcg_op_remove(TCGContext *s, TCGOp *op)
{
    TCGLabel *label;

    switch (op->opc) {
    case INDEX_op_br:
        label = arg_label(op->args[0]);
        label->refs--;
        break;
    case INDEX_op_brcond_i32:
    case INDEX_op_brcond_i64:
        label = arg_label(op->args[3]);
        label->refs--;
        break;
    case INDEX_op_brcond2_i32:
        label = arg_label(op->args[5]);
        label->refs--;
        break;
    default:
        break;
    }

    QTAILQ_REMOVE(&s->ops, op, link);
    QTAILQ_INSERT_TAIL(&s->free_ops, op, link);
    s->nb_ops--;
}